

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::IsIgnored
          (MessageDifferencer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer puVar1;
  IgnoreCriteria *pIVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  pointer puVar6;
  bool bVar7;
  FieldDescriptor *local_58;
  iterator local_50;
  iterator local_40;
  
  local_58 = field;
  local_40 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
             ::find<google::protobuf::FieldDescriptor_const*>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                         *)&this->ignored_fields_,&local_58);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&(this->ignored_fields_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  local_50.ctrl_ = (ctrl_t *)0x0;
  bVar3 = absl::lts_20250127::container_internal::operator==(&local_40,&local_50);
  bVar7 = true;
  if (bVar3) {
    puVar6 = (this->ignore_criteria_).
             super__Vector_base<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>,_std::allocator<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->ignore_criteria_).
             super__Vector_base<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>,_std::allocator<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = puVar6 != puVar1;
    if (bVar7) {
      pIVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
               .
               super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>
               ._M_head_impl;
      iVar5 = (*pIVar2->_vptr_IgnoreCriteria[2])(pIVar2,message1,message2,local_58,parent_fields);
      cVar4 = (char)iVar5;
      while (cVar4 == '\0') {
        puVar6 = puVar6 + 1;
        bVar7 = puVar6 != puVar1;
        if (puVar6 == puVar1) {
          return bVar7;
        }
        pIVar2 = (puVar6->_M_t).
                 super___uniq_ptr_impl<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>
                 ._M_head_impl;
        iVar5 = (*pIVar2->_vptr_IgnoreCriteria[2])(pIVar2,message1,message2,local_58,parent_fields);
        cVar4 = (char)iVar5;
      }
    }
  }
  return bVar7;
}

Assistant:

bool MessageDifferencer::IsIgnored(
    const Message& message1, const Message& message2,
    const FieldDescriptor* field,
    const std::vector<SpecificField>& parent_fields) {
  if (ignored_fields_.find(field) != ignored_fields_.end()) {
    return true;
  }
  for (const auto& criteria : ignore_criteria_) {
    if (criteria->IsIgnored(message1, message2, field, parent_fields)) {
      return true;
    }
  }
  return false;
}